

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:144:78)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:144:78)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  global_object *this_00;
  gc_heap_ptr_untyped local_30;
  
  this_00 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  local_30.heap_ = (this->f).check_type.prototype.super_gc_heap_ptr_untyped.heap_;
  local_30.pos_ = (this->f).check_type.prototype.super_gc_heap_ptr_untyped.pos_;
  if (local_30.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_30.heap_,&local_30);
  }
  global_object::validate_type(this_00,this_,(object_ptr *)&local_30,"String");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  if (this_->type_ == object) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(this_->field_1).s_);
    string_object::string_value((string_object *)&local_30);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_30.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_30.pos_;
    if (local_30.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_30.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
    return __return_storage_ptr__;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }